

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::SSBOLayoutCase::compareTypes
          (SSBOLayoutCase *this,BufferLayout *refLayout,BufferLayout *cmpLayout)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  TestLog *this_00;
  BufferBlock *this_01;
  char *pcVar5;
  ostream *poVar6;
  reference piVar7;
  MessageBuilder *pMVar8;
  int local_89c;
  MessageBuilder local_888;
  MessageBuilder local_708;
  char *local_588;
  char *local_580;
  MessageBuilder local_578;
  const_reference local_3f8;
  BufferVarLayoutEntry *refEntry;
  allocator<char> local_269;
  string local_268;
  int local_244;
  const_reference pvStack_240;
  int refEntryNdx;
  BufferVarLayoutEntry *cmpEntry;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_230;
  const_iterator ndxIter;
  BlockLayoutEntry *cmpBlockLayout;
  string local_218 [32];
  string local_1f8;
  int local_1d8;
  int cmpBlockNdx;
  undefined1 local_1c8 [8];
  ostringstream instanceName;
  int instanceNdx;
  int numInstances;
  bool isArray;
  BufferBlock *block;
  int blockNdx;
  int numBlocks;
  bool isOk;
  TestLog *log;
  BufferLayout *cmpLayout_local;
  BufferLayout *refLayout_local;
  SSBOLayoutCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  blockNdx._3_1_ = true;
  iVar3 = bb::ShaderInterface::getNumBlocks(&this->m_interface);
  for (block._4_4_ = 0; block._4_4_ < iVar3; block._4_4_ = block._4_4_ + 1) {
    this_01 = bb::ShaderInterface::getBlock(&this->m_interface,block._4_4_);
    bVar1 = bb::BufferBlock::isArray(this_01);
    if (bVar1) {
      local_89c = bb::BufferBlock::getArraySize(this_01);
    }
    else {
      local_89c = 1;
    }
    for (instanceName._372_4_ = 0; (int)instanceName._372_4_ < local_89c;
        instanceName._372_4_ = instanceName._372_4_ + 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      pcVar5 = bb::BufferBlock::getBlockName(this_01);
      std::operator<<((ostream *)local_1c8,pcVar5);
      if (bVar1) {
        poVar6 = std::operator<<((ostream *)local_1c8,"[");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,instanceName._372_4_);
        std::operator<<(poVar6,"]");
      }
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,pcVar5,(allocator<char> *)((long)&cmpBlockLayout + 7));
      iVar4 = bb::BufferLayout::getBlockIndex(cmpLayout,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&cmpBlockLayout + 7));
      std::__cxx11::string::~string(local_218);
      local_1d8 = iVar4;
      if (iVar4 < 0) {
        cmpBlockLayout._0_4_ = 7;
      }
      else {
        ndxIter._M_current =
             (int *)std::
                    vector<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                    ::operator[](&cmpLayout->blocks,(long)iVar4);
        local_230._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              (&((const_reference)ndxIter._M_current)->activeVarIndices);
        while( true ) {
          cmpEntry = (BufferVarLayoutEntry *)
                     std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)(ndxIter._M_current + 10));
          bVar2 = __gnu_cxx::operator!=
                            (&local_230,
                             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                              *)&cmpEntry);
          if (!bVar2) break;
          piVar7 = __gnu_cxx::
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_230);
          pvStack_240 = std::
                        vector<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
                        ::operator[](&cmpLayout->bufferVars,(long)*piVar7);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,pcVar5,&local_269)
          ;
          iVar4 = bb::BufferLayout::getVariableIndex(refLayout,&local_268);
          std::__cxx11::string::~string((string *)&local_268);
          std::allocator<char>::~allocator(&local_269);
          local_244 = iVar4;
          if (iVar4 < 0) {
            tcu::TestLog::operator<<
                      ((MessageBuilder *)&refEntry,this_00,
                       (BeginMessageToken *)&tcu::TestLog::Message);
            pMVar8 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)&refEntry,
                                (char (*) [25])"Error: Buffer variable \'");
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&pvStack_240->name);
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(char (*) [32])"\' not found in reference layout");
            tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&refEntry);
            blockNdx._3_1_ = false;
          }
          else {
            local_3f8 = std::
                        vector<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
                        ::operator[](&refLayout->bufferVars,(long)iVar4);
            if (local_3f8->type != pvStack_240->type) {
              tcu::TestLog::operator<<
                        (&local_578,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (&local_578,
                                  (char (*) [42])"Error: Buffer variable type mismatch in \'");
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_3f8->name);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])"\':\n");
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [13])"  expected: ");
              local_580 = glu::getDataTypeName(local_3f8->type);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_580);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2b9e07b);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [8])"  got: ");
              local_588 = glu::getDataTypeName(pvStack_240->type);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_588);
              tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_578);
              blockNdx._3_1_ = false;
            }
            if (local_3f8->arraySize < pvStack_240->arraySize) {
              tcu::TestLog::operator<<
                        (&local_708,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (&local_708,(char (*) [31])"Error: Invalid array size in \'");
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_3f8->name);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [16])"\': expected <= ");
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_3f8->arraySize);
              tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_708);
              blockNdx._3_1_ = false;
            }
            if (local_3f8->topLevelArraySize < pvStack_240->topLevelArraySize) {
              tcu::TestLog::operator<<
                        (&local_888,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (&local_888,
                                  (char (*) [41])"Error: Invalid top-level array size in \'");
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_3f8->name);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [16])"\': expected <= ");
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_3f8->topLevelArraySize);
              tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_888);
              blockNdx._3_1_ = false;
            }
          }
          __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator++(&local_230,0);
        }
        cmpBlockLayout._0_4_ = 0;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    }
  }
  return blockNdx._3_1_;
}

Assistant:

bool SSBOLayoutCase::compareTypes (const BufferLayout& refLayout, const BufferLayout& cmpLayout) const
{
	TestLog&	log			= m_testCtx.getLog();
	bool		isOk		= true;
	int			numBlocks	= m_interface.getNumBlocks();

	for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
	{
		const BufferBlock&		block			= m_interface.getBlock(blockNdx);
		bool					isArray			= block.isArray();
		int						numInstances	= isArray ? block.getArraySize() : 1;

		for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		{
			std::ostringstream instanceName;

			instanceName << block.getBlockName();
			if (isArray)
				instanceName << "[" << instanceNdx << "]";

			int cmpBlockNdx = cmpLayout.getBlockIndex(instanceName.str().c_str());

			if (cmpBlockNdx < 0)
				continue;

			const BlockLayoutEntry& cmpBlockLayout = cmpLayout.blocks[cmpBlockNdx];

			for (vector<int>::const_iterator ndxIter = cmpBlockLayout.activeVarIndices.begin(); ndxIter != cmpBlockLayout.activeVarIndices.end(); ndxIter++)
			{
				const BufferVarLayoutEntry&	cmpEntry	= cmpLayout.bufferVars[*ndxIter];
				int							refEntryNdx	= refLayout.getVariableIndex(cmpEntry.name.c_str());

				if (refEntryNdx < 0)
				{
					log << TestLog::Message << "Error: Buffer variable '" << cmpEntry.name << "' not found in reference layout" << TestLog::EndMessage;
					isOk = false;
					continue;
				}

				const BufferVarLayoutEntry&	refEntry	= refLayout.bufferVars[refEntryNdx];

				if (refEntry.type != cmpEntry.type)
				{
					log << TestLog::Message << "Error: Buffer variable type mismatch in '" << refEntry.name << "':\n"
						<< "  expected: " << glu::getDataTypeName(refEntry.type) << "\n"
						<< "  got: " << glu::getDataTypeName(cmpEntry.type)
						<< TestLog::EndMessage;
					isOk = false;
				}

				if (refEntry.arraySize < cmpEntry.arraySize)
				{
					log << TestLog::Message << "Error: Invalid array size in '" << refEntry.name << "': expected <= " << refEntry.arraySize << TestLog::EndMessage;
					isOk = false;
				}

				if (refEntry.topLevelArraySize < cmpEntry.topLevelArraySize)
				{
					log << TestLog::Message << "Error: Invalid top-level array size in '" << refEntry.name << "': expected <= " << refEntry.topLevelArraySize << TestLog::EndMessage;
					isOk = false;
				}
			}
		}
	}

	return isOk;
}